

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::AdvGraphicsTestInstance::~AdvGraphicsTestInstance
          (AdvGraphicsTestInstance *this)

{
  ~AdvGraphicsTestInstance(this);
  operator_delete(this,0x5e8);
  return;
}

Assistant:

AdvGraphicsTestInstance::~AdvGraphicsTestInstance(void)
{
}